

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O3

int yylex_init(yyscan_t *ptr_yy_globals)

{
  void *pvVar1;
  int *piVar2;
  int iVar3;
  
  if (ptr_yy_globals == (yyscan_t *)0x0) {
    iVar3 = 0x16;
  }
  else {
    pvVar1 = calloc(1,0x90);
    *ptr_yy_globals = pvVar1;
    if (pvVar1 != (void *)0x0) {
      return 0;
    }
    iVar3 = 0xc;
  }
  piVar2 = __errno_location();
  *piVar2 = iVar3;
  return 1;
}

Assistant:

int yylex_init(yyscan_t* ptr_yy_globals)
{
    if (ptr_yy_globals == NULL){
        errno = EINVAL;
        return 1;
    }

    *ptr_yy_globals = (yyscan_t) yyalloc ( sizeof( struct yyguts_t ), NULL );

    if (*ptr_yy_globals == NULL){
        errno = ENOMEM;
        return 1;
    }

    /* By setting to 0xAA, we expose bugs in yy_init_globals. Leave at 0x00 for releases. */
    memset(*ptr_yy_globals,0x00,sizeof(struct yyguts_t));

    return yy_init_globals ( *ptr_yy_globals );
}